

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O3

String * asl::Directory::createTemp(void)

{
  File *this;
  uint uVar1;
  undefined8 uVar2;
  String *in_RDI;
  ulong uVar3;
  double dVar4;
  double dVar5;
  String tmpDir;
  String local_98;
  undefined1 local_80 [12];
  int local_74;
  anon_union_16_2_78e7fdac_for_String_2 local_70;
  Date local_58;
  
  (in_RDI->field_2)._space[0] = '\0';
  in_RDI->_size = 0;
  in_RDI->_len = 0;
  dVar4 = now();
  String::String(&local_98,"/tmp");
  dVar5 = floor(dVar4 * 0.01);
  uVar3 = (ulong)((dVar4 * 0.01 - dVar5) * 2000000000.0);
  uVar1 = getpid();
  this = (File *)(local_80 + 8);
  do {
    uVar2 = &local_98.field_2;
    if (local_98._size != 0) {
      uVar2 = local_98.field_2._str;
    }
    String::f((String *)this,"%s/%04x%08x%08x",uVar2,(ulong)uVar1,(ulong)in_RDI & 0xffffffff,
              uVar3 & 0xffffffff);
    uVar2 = &local_70;
    if (local_80._8_4_ != 0) {
      uVar2 = local_70._str;
    }
    String::assign(in_RDI,(char *)uVar2,local_74);
    if (local_80._8_4_ != 0) {
      free(local_70._str);
    }
    File::File(this,in_RDI);
    local_58._t = -NAN;
    File::creationDate((File *)local_80);
    uVar2 = local_80._0_8_;
    File::~File(this);
    uVar3 = (ulong)((int)uVar3 + 1);
  } while (((double)uVar2 != 0.0) || (NAN((double)uVar2)));
  create(in_RDI);
  if (local_98._size != 0) {
    free(local_98.field_2._str);
  }
  return in_RDI;
}

Assistant:

String Directory::createTemp()
{
	String dir;
	unsigned num = (unsigned)(2e9 * fract(0.01 * now()));
	unsigned p = (unsigned int)(size_t)&dir;
#ifdef _WIN32
	TCHAR tmpdir[MAX_PATH];
	DWORD ret = GetTempPath(MAX_PATH, tmpdir);
	String tmpDir = tmpdir;
	if (ret > MAX_PATH || ret == 0)
		return dir;
	unsigned pid = (unsigned int)GetCurrentProcessId();
#else
	String tmpDir = "/tmp";
	unsigned pid = (unsigned)getpid();
#endif
	do {
		dir = String::f("%s/%04x%08x%08x", *tmpDir, pid, p, num++);
	} while (File(dir).exists());
	create(dir);
	return dir;
}